

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O0

int __thiscall ncnn::Convolution::load_model(Convolution *this,ModelBin *mb)

{
  int *piVar1;
  void **ppvVar2;
  long *in_RSI;
  long in_RDI;
  bool bVar3;
  void *local_408;
  int *local_400;
  long *local_3e8;
  void *local_3c0;
  int *local_3b8;
  undefined8 local_3b0;
  undefined4 local_3a8;
  long *local_3a0;
  undefined4 local_398;
  undefined4 local_394;
  undefined4 local_390;
  undefined4 local_38c;
  undefined4 local_388;
  undefined8 local_380;
  void *local_378;
  int *local_370;
  undefined8 local_368;
  undefined4 local_360;
  long *local_358;
  undefined4 local_350;
  undefined4 local_34c;
  undefined4 local_348;
  undefined4 local_344;
  undefined4 local_340;
  undefined8 local_338;
  void *local_330;
  int *local_328;
  undefined8 local_320;
  undefined4 local_318;
  long *local_310;
  undefined4 local_308;
  undefined4 local_304;
  undefined4 local_300;
  undefined4 local_2fc;
  undefined4 local_2f8;
  undefined8 local_2f0;
  void *local_2d8;
  int *local_2d0;
  undefined8 local_2c8;
  undefined4 local_2c0;
  long *local_2b8;
  undefined4 local_2b0;
  undefined4 local_2ac;
  undefined4 local_2a8;
  undefined4 local_2a4;
  undefined4 local_2a0;
  undefined8 local_298;
  long *local_290;
  int local_27c;
  void **local_278;
  void **local_268;
  void **local_258;
  void **local_248;
  void **local_238;
  int local_228;
  undefined4 local_224;
  void **local_220;
  void **local_218;
  void **local_210;
  int local_208;
  undefined4 local_204;
  void **local_200;
  void **local_1f8;
  void **local_1f0;
  int local_1e8;
  undefined4 local_1e4;
  void **local_1e0;
  void **local_1d8;
  void **local_1d0;
  int local_1c8;
  undefined4 local_1c4;
  void **local_1c0;
  void **local_1b8;
  void **local_1b0;
  int local_1a8;
  undefined4 local_1a4;
  void **local_1a0;
  void **local_198;
  void **local_190;
  long *local_188;
  long *local_180;
  int local_178;
  undefined4 local_174;
  void **local_170;
  int local_168;
  undefined4 local_164;
  void **local_160;
  int local_158;
  undefined4 local_154;
  void **local_150;
  int local_148;
  undefined4 local_144;
  void **local_140;
  int local_138;
  undefined4 local_134;
  void **local_130;
  int local_118;
  undefined4 local_114;
  void **local_110;
  int local_f8;
  undefined4 local_f4;
  void **local_f0;
  int local_d8;
  undefined4 local_d4;
  void **local_d0;
  int local_b8;
  undefined4 local_b4;
  void **local_b0;
  int local_98;
  undefined4 local_94;
  void **local_90;
  void *local_38;
  void *local_30;
  void *local_28;
  void *local_20;
  void *local_18;
  long *local_10;
  long *local_8;
  
  if (*(int *)(in_RDI + 0x158) == 0) {
    local_290 = in_RSI;
    (**(code **)(*in_RSI + 0x10))(&local_2d8,in_RSI,*(undefined4 *)(in_RDI + 0x104),0);
    ppvVar2 = (void **)(in_RDI + 0x160);
    local_1a0 = &local_2d8;
    local_198 = ppvVar2;
    if (ppvVar2 != local_1a0) {
      if (local_2d0 != (int *)0x0) {
        local_1a4 = 1;
        LOCK();
        local_1a8 = *local_2d0;
        *local_2d0 = *local_2d0 + 1;
        UNLOCK();
      }
      local_170 = ppvVar2;
      if (*(long *)(in_RDI + 0x168) != 0) {
        piVar1 = *(int **)(in_RDI + 0x168);
        local_174 = 0xffffffff;
        LOCK();
        local_178 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_178 == 1) {
          if (*(long *)(in_RDI + 0x180) == 0) {
            local_18 = *ppvVar2;
            if (local_18 != (void *)0x0) {
              free(local_18);
            }
          }
          else {
            (**(code **)(**(long **)(in_RDI + 0x180) + 0x18))(*(long **)(in_RDI + 0x180),*ppvVar2);
          }
        }
      }
      *ppvVar2 = (void *)0x0;
      *(undefined8 *)(in_RDI + 0x170) = 0;
      *(undefined4 *)(in_RDI + 0x178) = 0;
      *(undefined4 *)(in_RDI + 0x188) = 0;
      *(undefined4 *)(in_RDI + 0x18c) = 0;
      *(undefined4 *)(in_RDI + 400) = 0;
      *(undefined4 *)(in_RDI + 0x194) = 0;
      *(undefined4 *)(in_RDI + 0x198) = 0;
      *(undefined8 *)(in_RDI + 0x1a0) = 0;
      *(undefined8 *)(in_RDI + 0x168) = 0;
      *ppvVar2 = *local_1a0;
      *(void **)(in_RDI + 0x168) = local_1a0[1];
      *(void **)(in_RDI + 0x170) = local_1a0[2];
      *(undefined4 *)(in_RDI + 0x178) = *(undefined4 *)(local_1a0 + 3);
      *(void **)(in_RDI + 0x180) = local_1a0[4];
      *(undefined4 *)(in_RDI + 0x188) = *(undefined4 *)(local_1a0 + 5);
      *(undefined4 *)(in_RDI + 0x18c) = *(undefined4 *)((long)local_1a0 + 0x2c);
      *(undefined4 *)(in_RDI + 400) = *(undefined4 *)(local_1a0 + 6);
      *(undefined4 *)(in_RDI + 0x194) = *(undefined4 *)((long)local_1a0 + 0x34);
      *(undefined4 *)(in_RDI + 0x198) = *(undefined4 *)(local_1a0 + 7);
      *(void **)(in_RDI + 0x1a0) = local_1a0[8];
    }
    local_278 = &local_2d8;
    local_190 = ppvVar2;
    local_90 = local_278;
    if (local_2d0 != (int *)0x0) {
      local_94 = 0xffffffff;
      LOCK();
      local_98 = *local_2d0;
      *local_2d0 = *local_2d0 + -1;
      UNLOCK();
      if (local_98 == 1) {
        if (local_2b8 == (long *)0x0) {
          if (local_2d8 != (void *)0x0) {
            free(local_2d8);
          }
        }
        else {
          (**(code **)(*local_2b8 + 0x18))(local_2b8,local_2d8);
        }
      }
    }
    local_2d8 = (void *)0x0;
    local_2c8 = 0;
    local_2c0 = 0;
    local_2b0 = 0;
    local_2ac = 0;
    local_2a8 = 0;
    local_2a4 = 0;
    local_2a0 = 0;
    local_298 = 0;
    local_2d0 = (int *)0x0;
    local_180 = (long *)(in_RDI + 0x160);
    bVar3 = true;
    if (*local_180 != 0) {
      bVar3 = *(long *)(in_RDI + 0x1a0) * (long)*(int *)(in_RDI + 0x198) == 0;
      local_10 = local_180;
    }
    if (bVar3) {
      local_27c = -100;
    }
    else {
      if (*(int *)(in_RDI + 0x100) != 0) {
        (**(code **)(*local_290 + 0x10))(&local_330,local_290,*(undefined4 *)(in_RDI + 0xd0),1);
        ppvVar2 = (void **)(in_RDI + 0x1a8);
        local_1c0 = &local_330;
        local_1b8 = ppvVar2;
        if (ppvVar2 != local_1c0) {
          if (local_328 != (int *)0x0) {
            local_1c4 = 1;
            LOCK();
            local_1c8 = *local_328;
            *local_328 = *local_328 + 1;
            UNLOCK();
          }
          local_160 = ppvVar2;
          if (*(long *)(in_RDI + 0x1b0) != 0) {
            piVar1 = *(int **)(in_RDI + 0x1b0);
            local_164 = 0xffffffff;
            LOCK();
            local_168 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_168 == 1) {
              if (*(long *)(in_RDI + 0x1c8) == 0) {
                local_20 = *ppvVar2;
                if (local_20 != (void *)0x0) {
                  free(local_20);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x1c8) + 0x18))
                          (*(long **)(in_RDI + 0x1c8),*ppvVar2);
              }
            }
          }
          *ppvVar2 = (void *)0x0;
          *(undefined8 *)(in_RDI + 0x1b8) = 0;
          *(undefined4 *)(in_RDI + 0x1c0) = 0;
          *(undefined4 *)(in_RDI + 0x1d0) = 0;
          *(undefined4 *)(in_RDI + 0x1d4) = 0;
          *(undefined4 *)(in_RDI + 0x1d8) = 0;
          *(undefined4 *)(in_RDI + 0x1dc) = 0;
          *(undefined4 *)(in_RDI + 0x1e0) = 0;
          *(undefined8 *)(in_RDI + 0x1e8) = 0;
          *(undefined8 *)(in_RDI + 0x1b0) = 0;
          *ppvVar2 = *local_1c0;
          *(void **)(in_RDI + 0x1b0) = local_1c0[1];
          *(void **)(in_RDI + 0x1b8) = local_1c0[2];
          *(undefined4 *)(in_RDI + 0x1c0) = *(undefined4 *)(local_1c0 + 3);
          *(void **)(in_RDI + 0x1c8) = local_1c0[4];
          *(undefined4 *)(in_RDI + 0x1d0) = *(undefined4 *)(local_1c0 + 5);
          *(undefined4 *)(in_RDI + 0x1d4) = *(undefined4 *)((long)local_1c0 + 0x2c);
          *(undefined4 *)(in_RDI + 0x1d8) = *(undefined4 *)(local_1c0 + 6);
          *(undefined4 *)(in_RDI + 0x1dc) = *(undefined4 *)((long)local_1c0 + 0x34);
          *(undefined4 *)(in_RDI + 0x1e0) = *(undefined4 *)(local_1c0 + 7);
          *(void **)(in_RDI + 0x1e8) = local_1c0[8];
        }
        local_268 = &local_330;
        local_1b0 = ppvVar2;
        local_b0 = local_268;
        if (local_328 != (int *)0x0) {
          local_b4 = 0xffffffff;
          LOCK();
          local_b8 = *local_328;
          *local_328 = *local_328 + -1;
          UNLOCK();
          if (local_b8 == 1) {
            if (local_310 == (long *)0x0) {
              if (local_330 != (void *)0x0) {
                free(local_330);
              }
            }
            else {
              (**(code **)(*local_310 + 0x18))(local_310,local_330);
            }
          }
        }
        local_330 = (void *)0x0;
        local_320 = 0;
        local_318 = 0;
        local_308 = 0;
        local_304 = 0;
        local_300 = 0;
        local_2fc = 0;
        local_2f8 = 0;
        local_2f0 = 0;
        local_328 = (int *)0x0;
        local_188 = (long *)(in_RDI + 0x1a8);
        bVar3 = true;
        if (*local_188 != 0) {
          bVar3 = *(long *)(in_RDI + 0x1e8) * (long)*(int *)(in_RDI + 0x1e0) == 0;
          local_8 = local_188;
        }
        if (bVar3) {
          return -100;
        }
      }
      if (*(int *)(in_RDI + 0x108) != 0) {
        (**(code **)(*local_290 + 0x10))(&local_378,local_290,*(undefined4 *)(in_RDI + 0xd0),1);
        ppvVar2 = (void **)(in_RDI + 0x1f0);
        local_1e0 = &local_378;
        local_1d8 = ppvVar2;
        if (ppvVar2 != local_1e0) {
          if (local_370 != (int *)0x0) {
            local_1e4 = 1;
            LOCK();
            local_1e8 = *local_370;
            *local_370 = *local_370 + 1;
            UNLOCK();
          }
          local_150 = ppvVar2;
          if (*(long *)(in_RDI + 0x1f8) != 0) {
            piVar1 = *(int **)(in_RDI + 0x1f8);
            local_154 = 0xffffffff;
            LOCK();
            local_158 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_158 == 1) {
              if (*(long *)(in_RDI + 0x210) == 0) {
                local_28 = *ppvVar2;
                if (local_28 != (void *)0x0) {
                  free(local_28);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x210) + 0x18))
                          (*(long **)(in_RDI + 0x210),*ppvVar2);
              }
            }
          }
          *ppvVar2 = (void *)0x0;
          *(undefined8 *)(in_RDI + 0x200) = 0;
          *(undefined4 *)(in_RDI + 0x208) = 0;
          *(undefined4 *)(in_RDI + 0x218) = 0;
          *(undefined4 *)(in_RDI + 0x21c) = 0;
          *(undefined4 *)(in_RDI + 0x220) = 0;
          *(undefined4 *)(in_RDI + 0x224) = 0;
          *(undefined4 *)(in_RDI + 0x228) = 0;
          *(undefined8 *)(in_RDI + 0x230) = 0;
          *(undefined8 *)(in_RDI + 0x1f8) = 0;
          *ppvVar2 = *local_1e0;
          *(void **)(in_RDI + 0x1f8) = local_1e0[1];
          *(void **)(in_RDI + 0x200) = local_1e0[2];
          *(undefined4 *)(in_RDI + 0x208) = *(undefined4 *)(local_1e0 + 3);
          *(void **)(in_RDI + 0x210) = local_1e0[4];
          *(undefined4 *)(in_RDI + 0x218) = *(undefined4 *)(local_1e0 + 5);
          *(undefined4 *)(in_RDI + 0x21c) = *(undefined4 *)((long)local_1e0 + 0x2c);
          *(undefined4 *)(in_RDI + 0x220) = *(undefined4 *)(local_1e0 + 6);
          *(undefined4 *)(in_RDI + 0x224) = *(undefined4 *)((long)local_1e0 + 0x34);
          *(undefined4 *)(in_RDI + 0x228) = *(undefined4 *)(local_1e0 + 7);
          *(void **)(in_RDI + 0x230) = local_1e0[8];
        }
        local_258 = &local_378;
        local_1d0 = ppvVar2;
        local_d0 = local_258;
        if (local_370 != (int *)0x0) {
          local_d4 = 0xffffffff;
          LOCK();
          local_d8 = *local_370;
          *local_370 = *local_370 + -1;
          UNLOCK();
          if (local_d8 == 1) {
            if (local_358 == (long *)0x0) {
              if (local_378 != (void *)0x0) {
                free(local_378);
              }
            }
            else {
              (**(code **)(*local_358 + 0x18))(local_358,local_378);
            }
          }
        }
        local_378 = (void *)0x0;
        local_368 = 0;
        local_360 = 0;
        local_350 = 0;
        local_34c = 0;
        local_348 = 0;
        local_344 = 0;
        local_340 = 0;
        local_338 = 0;
        local_370 = (int *)0x0;
        (**(code **)(*local_290 + 0x10))(&local_3c0,local_290,1);
        ppvVar2 = (void **)(in_RDI + 0x238);
        local_200 = &local_3c0;
        local_1f8 = ppvVar2;
        if (ppvVar2 != local_200) {
          if (local_3b8 != (int *)0x0) {
            local_204 = 1;
            LOCK();
            local_208 = *local_3b8;
            *local_3b8 = *local_3b8 + 1;
            UNLOCK();
          }
          local_140 = ppvVar2;
          if (*(long *)(in_RDI + 0x240) != 0) {
            piVar1 = *(int **)(in_RDI + 0x240);
            local_144 = 0xffffffff;
            LOCK();
            local_148 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_148 == 1) {
              if (*(long *)(in_RDI + 600) == 0) {
                local_30 = *ppvVar2;
                if (local_30 != (void *)0x0) {
                  free(local_30);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 600) + 0x18))(*(long **)(in_RDI + 600),*ppvVar2);
              }
            }
          }
          *ppvVar2 = (void *)0x0;
          *(undefined8 *)(in_RDI + 0x248) = 0;
          *(undefined4 *)(in_RDI + 0x250) = 0;
          *(undefined4 *)(in_RDI + 0x260) = 0;
          *(undefined4 *)(in_RDI + 0x264) = 0;
          *(undefined4 *)(in_RDI + 0x268) = 0;
          *(undefined4 *)(in_RDI + 0x26c) = 0;
          *(undefined4 *)(in_RDI + 0x270) = 0;
          *(undefined8 *)(in_RDI + 0x278) = 0;
          *(undefined8 *)(in_RDI + 0x240) = 0;
          *ppvVar2 = *local_200;
          *(void **)(in_RDI + 0x240) = local_200[1];
          *(void **)(in_RDI + 0x248) = local_200[2];
          *(undefined4 *)(in_RDI + 0x250) = *(undefined4 *)(local_200 + 3);
          *(void **)(in_RDI + 600) = local_200[4];
          *(undefined4 *)(in_RDI + 0x260) = *(undefined4 *)(local_200 + 5);
          *(undefined4 *)(in_RDI + 0x264) = *(undefined4 *)((long)local_200 + 0x2c);
          *(undefined4 *)(in_RDI + 0x268) = *(undefined4 *)(local_200 + 6);
          *(undefined4 *)(in_RDI + 0x26c) = *(undefined4 *)((long)local_200 + 0x34);
          *(undefined4 *)(in_RDI + 0x270) = *(undefined4 *)(local_200 + 7);
          *(void **)(in_RDI + 0x278) = local_200[8];
        }
        local_248 = &local_3c0;
        local_1f0 = ppvVar2;
        local_f0 = local_248;
        if (local_3b8 != (int *)0x0) {
          local_f4 = 0xffffffff;
          LOCK();
          local_f8 = *local_3b8;
          *local_3b8 = *local_3b8 + -1;
          UNLOCK();
          if (local_f8 == 1) {
            if (local_3a0 == (long *)0x0) {
              if (local_3c0 != (void *)0x0) {
                free(local_3c0);
              }
            }
            else {
              (**(code **)(*local_3a0 + 0x18))(local_3a0,local_3c0);
            }
          }
        }
        local_3c0 = (void *)0x0;
        local_3b0 = 0;
        local_3a8 = 0;
        local_398 = 0;
        local_394 = 0;
        local_390 = 0;
        local_38c = 0;
        local_388 = 0;
        local_380 = 0;
        local_3b8 = (int *)0x0;
      }
      if (100 < *(int *)(in_RDI + 0x108)) {
        (**(code **)(*local_290 + 0x10))(&local_408,local_290,1);
        ppvVar2 = (void **)(in_RDI + 0x280);
        local_220 = &local_408;
        local_218 = ppvVar2;
        if (ppvVar2 != local_220) {
          if (local_400 != (int *)0x0) {
            local_224 = 1;
            LOCK();
            local_228 = *local_400;
            *local_400 = *local_400 + 1;
            UNLOCK();
          }
          local_130 = ppvVar2;
          if (*(long *)(in_RDI + 0x288) != 0) {
            piVar1 = *(int **)(in_RDI + 0x288);
            local_134 = 0xffffffff;
            LOCK();
            local_138 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_138 == 1) {
              if (*(long *)(in_RDI + 0x2a0) == 0) {
                local_38 = *ppvVar2;
                if (local_38 != (void *)0x0) {
                  free(local_38);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x2a0) + 0x18))
                          (*(long **)(in_RDI + 0x2a0),*ppvVar2);
              }
            }
          }
          *ppvVar2 = (void *)0x0;
          *(undefined8 *)(in_RDI + 0x290) = 0;
          *(undefined4 *)(in_RDI + 0x298) = 0;
          *(undefined4 *)(in_RDI + 0x2a8) = 0;
          *(undefined4 *)(in_RDI + 0x2ac) = 0;
          *(undefined4 *)(in_RDI + 0x2b0) = 0;
          *(undefined4 *)(in_RDI + 0x2b4) = 0;
          *(undefined4 *)(in_RDI + 0x2b8) = 0;
          *(undefined8 *)(in_RDI + 0x2c0) = 0;
          *(undefined8 *)(in_RDI + 0x288) = 0;
          *ppvVar2 = *local_220;
          *(void **)(in_RDI + 0x288) = local_220[1];
          *(void **)(in_RDI + 0x290) = local_220[2];
          *(undefined4 *)(in_RDI + 0x298) = *(undefined4 *)(local_220 + 3);
          *(void **)(in_RDI + 0x2a0) = local_220[4];
          *(undefined4 *)(in_RDI + 0x2a8) = *(undefined4 *)(local_220 + 5);
          *(undefined4 *)(in_RDI + 0x2ac) = *(undefined4 *)((long)local_220 + 0x2c);
          *(undefined4 *)(in_RDI + 0x2b0) = *(undefined4 *)(local_220 + 6);
          *(undefined4 *)(in_RDI + 0x2b4) = *(undefined4 *)((long)local_220 + 0x34);
          *(undefined4 *)(in_RDI + 0x2b8) = *(undefined4 *)(local_220 + 7);
          *(void **)(in_RDI + 0x2c0) = local_220[8];
        }
        local_238 = &local_408;
        if (local_400 != (int *)0x0) {
          local_114 = 0xffffffff;
          LOCK();
          local_118 = *local_400;
          *local_400 = *local_400 + -1;
          UNLOCK();
          if (local_118 == 1) {
            local_210 = ppvVar2;
            local_110 = local_238;
            if (local_3e8 == (long *)0x0) {
              if (local_408 != (void *)0x0) {
                free(local_408);
              }
            }
            else {
              (**(code **)(*local_3e8 + 0x18))(local_3e8,local_408);
            }
          }
        }
      }
      local_27c = 0;
    }
  }
  else {
    local_27c = 0;
  }
  return local_27c;
}

Assistant:

int Convolution::load_model(const ModelBin& mb)
{
    if (dynamic_weight)
        return 0;

    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

#if NCNN_INT8
    if (int8_scale_term)
    {
        weight_data_int8_scales = mb.load(num_output, 1);
        bottom_blob_int8_scales = mb.load(1, 1);
    }

    if (int8_scale_term > 100)
    {
        top_blob_int8_scales = mb.load(1, 1);
    }
#endif // NCNN_INT8

    return 0;
}